

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::renderRawVariable
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          VariableTag *tag,SizeT *offset)

{
  int iVar1;
  ushort uVar2;
  SizeT SVar3;
  bool bVar4;
  Value<char> *this_00;
  size_t in_RCX;
  
  SVar3 = tag->Offset;
  uVar2 = tag->Length;
  iVar1 = SVar3 - 5;
  StringStream<char>::write
            (this->stream_,*offset + (int)this->content_,(void *)(ulong)(iVar1 - *offset),in_RCX);
  *offset = uVar2 + 1 + SVar3;
  this_00 = getValue(this,tag);
  if (this_00 != (Value<char> *)0x0) {
    in_RCX = 0;
    bVar4 = Value<char>::
            CopyValueTo<Qentem::StringStream<char>,void(Qentem::StringStream<char>,char_const*,unsigned_int)>
                      (this_00,this->stream_,(RealFormatInfo)0x200000002,
                       (_func_void_StringStream<char>_char_ptr_uint *)0x0);
    if (bVar4) {
      return;
    }
  }
  StringStream<char>::write
            (this->stream_,iVar1 + (int)this->content_,(void *)(ulong)(uVar2 + 6),in_RCX);
  return;
}

Assistant:

void renderRawVariable(const VariableTag &tag, SizeT &offset) const {
        const SizeT t_offset = (tag.Offset - TagPatterns::RawVariablePrefixLength);
        const SizeT length   = (tag.Length + TagPatterns::RawVariableFullLength);

        stream_->Write((content_ + offset), (t_offset - offset));
        offset = t_offset;
        offset += length;

        const Value_T *value = getValue(tag);

        if ((value == nullptr) ||
            !(value->CopyValueTo(*stream_, {Config::TemplatePrecision, QENTEM_TEMPLATE_DOUBLE_FORMAT}))) {
            stream_->Write((content_ + t_offset), length);
        }
    }